

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O3

void __thiscall Js::CompoundString::BlockInfo::CopyFrom(BlockInfo *this,Block *block)

{
  Block *pBVar1;
  Type TVar2;
  
  pBVar1 = (block->bufferOwner).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->buffer).ptr = pBVar1 + 1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  TVar2 = block->charCapacity;
  this->charLength = block->charLength;
  this->charCapacity = TVar2;
  return;
}

Assistant:

void CompoundString::BlockInfo::CopyFrom(Block *const block)
    {
        buffer = block->Buffer();
        charLength = block->CharLength();
        charCapacity = block->CharCapacity();
    }